

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool __thiscall
wallet::MockableBatch::ReadKey(MockableBatch *this,DataStream *key,DataStream *value)

{
  iterator __first;
  _Base_ptr *__n;
  DataStream *in_RDX;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_RDI;
  long in_FS_OFFSET;
  iterator *it;
  SerializeData key_data;
  DataStream *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  DataStream *in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff60;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_stack_ffffffffffffff80;
  bool local_49;
  int local_48;
  void *local_40;
  _Base_ptr local_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)(in_RDI->super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>)._M_impl
              .super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    local_49 = false;
  }
  else {
    DataStream::begin(in_stack_ffffffffffffff48);
    __first = DataStream::end((DataStream *)
                              CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
    vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
              (in_RDI,(__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                       )__first._M_current,in_stack_ffffffffffffff80,in_stack_ffffffffffffff60);
    local_30[0] = (_Base_ptr)
                  std::
                  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                  ::find((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                         &in_stack_ffffffffffffff38->vch);
    __n = local_30;
    std::
    map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
    ::end((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    local_49 = std::operator==((_Self *)in_stack_ffffffffffffff48,
                               (_Self *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40
                                                ));
    if (!local_49) {
      DataStream::clear(in_stack_ffffffffffffff38);
      std::
      _Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
                    *)in_stack_ffffffffffffff38);
      Span<std::byte_const>::Span<std::vector<std::byte,zero_after_free_allocator<std::byte>>>
                ((Span<const_std::byte> *)in_RDX,
                 (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      DataStream::write(in_RDX,local_48,local_40,(size_t)__n);
      in_stack_ffffffffffffff48 = in_RDX;
    }
    local_49 = !local_49;
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
              (&in_stack_ffffffffffffff48->vch);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_49;
}

Assistant:

bool MockableBatch::ReadKey(DataStream&& key, DataStream& value)
{
    if (!m_pass) {
        return false;
    }
    SerializeData key_data{key.begin(), key.end()};
    const auto& it = m_records.find(key_data);
    if (it == m_records.end()) {
        return false;
    }
    value.clear();
    value.write(it->second);
    return true;
}